

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_interpolation.c
# Opt level: O0

gdImagePtr gdImageRotateGeneric(gdImagePtr src,float degrees,int bgColor)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  float fVar8;
  double dVar9;
  double dVar10;
  long n;
  long m;
  gdFixed f_n;
  gdFixed f_m;
  gdFixed f_j;
  gdFixed f_i;
  undefined1 local_80 [4];
  uint j;
  gdRect bbox;
  int new_height;
  int new_width;
  gdImagePtr dst;
  uint local_58;
  uint i;
  uint dst_offset_y;
  uint dst_offset_x;
  gdFixed f_sin;
  gdFixed f_cos;
  gdFixed f_W;
  gdFixed f_H;
  int src_h;
  int src_w;
  float _angle;
  int bgColor_local;
  float degrees_local;
  gdImagePtr src_local;
  
  fVar8 = (-degrees / 180.0) * 3.1415927;
  iVar1 = src->sx;
  iVar2 = src->sy;
  dVar9 = cos((double)-fVar8);
  dVar10 = sin((double)-fVar8);
  local_58 = 0;
  if (bgColor < 0) {
    src_local = (gdImagePtr)0x0;
  }
  else {
    if (src->interpolation == (interpolation_method)0x0) {
      gdImageSetInterpolationMethod(src,GD_DEFAULT);
    }
    gdRotatedImageSize(src,degrees,(gdRectPtr)local_80);
    bbox.height = bbox.x;
    bbox.width = bbox.y;
    src_local = gdImageCreateTrueColor(bbox.x,bbox.y);
    if (src_local == (gdImagePtr)0x0) {
      src_local = (gdImagePtr)0x0;
    }
    else {
      src_local->saveAlphaFlag = 1;
      for (dst._4_4_ = 0; dst._4_4_ < (uint)bbox.width; dst._4_4_ = dst._4_4_ + 1) {
        i = 0;
        for (f_i._4_4_ = 0; f_i._4_4_ < (uint)bbox.height; f_i._4_4_ = f_i._4_4_ + 1) {
          lVar4 = (long)(int)((dst._4_4_ - bbox.width / 2) * 0x100);
          lVar5 = (long)(int)((f_i._4_4_ - bbox.height / 2) * 0x100);
          lVar6 = (lVar5 * (long)(dVar10 * 256.0) >> 8) + (lVar4 * (long)(dVar9 * 256.0) >> 8) +
                  (long)(iVar2 / 2 << 8);
          lVar4 = ((lVar5 * (long)(dVar9 * 256.0) >> 8) - (lVar4 * (long)(dVar10 * 256.0) >> 8)) +
                  (long)(iVar1 / 2 << 8);
          lVar5 = lVar6 >> 8;
          lVar7 = lVar4 >> 8;
          if ((((lVar5 < -1) || (lVar7 < -1)) || (iVar2 <= lVar5)) || (iVar1 <= lVar7)) {
            src_local->tpixels[local_58][i] = bgColor;
          }
          else {
            iVar3 = getPixelInterpolated(src,(double)lVar4 / 256.0,(double)lVar6 / 256.0,bgColor);
            src_local->tpixels[local_58][i] = iVar3;
          }
          i = i + 1;
        }
        local_58 = local_58 + 1;
      }
    }
  }
  return src_local;
}

Assistant:

static gdImagePtr
gdImageRotateGeneric(gdImagePtr src, const float degrees, const int bgColor)
{
	float _angle = ((float) (-degrees / 180.0f) * (float)M_PI);
	const int src_w  = gdImageSX(src);
	const int src_h = gdImageSY(src);
	const gdFixed f_H = gd_itofx(src_h/2);
	const gdFixed f_W = gd_itofx(src_w/2);
	const gdFixed f_cos = gd_ftofx(cos(-_angle));
	const gdFixed f_sin = gd_ftofx(sin(-_angle));

	unsigned int dst_offset_x;
	unsigned int dst_offset_y = 0;
	unsigned int i;
	gdImagePtr dst;
	int new_width, new_height;
	gdRect bbox;

	if (bgColor < 0) {
		return NULL;
	}

	if (src->interpolation == NULL) {
		gdImageSetInterpolationMethod(src, GD_DEFAULT);
	}

    gdRotatedImageSize(src, degrees, &bbox);
    new_width = bbox.width;
    new_height = bbox.height;

	dst = gdImageCreateTrueColor(new_width, new_height);
	if (!dst) {
		return NULL;
	}
	dst->saveAlphaFlag = 1;

	for (i = 0; i < new_height; i++) {
		unsigned int j;
		dst_offset_x = 0;
		for (j = 0; j < new_width; j++) {
			gdFixed f_i = gd_itofx((int)i - (int)new_height / 2);
			gdFixed f_j = gd_itofx((int)j - (int)new_width  / 2);
			gdFixed f_m = gd_mulfx(f_j,f_sin) + gd_mulfx(f_i,f_cos) + f_H;
			gdFixed f_n = gd_mulfx(f_j,f_cos) - gd_mulfx(f_i,f_sin)  + f_W;
			long m = gd_fxtoi(f_m);
			long n = gd_fxtoi(f_n);

			if (m < -1 || n < -1 || m >= src_h || n >= src_w ) {
				dst->tpixels[dst_offset_y][dst_offset_x++] = bgColor;
			} else {
				dst->tpixels[dst_offset_y][dst_offset_x++] = getPixelInterpolated(src, gd_fxtod(f_n), gd_fxtod(f_m), bgColor);
			}
		}
		dst_offset_y++;
	}
	return dst;
}